

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_properties.h
# Opt level: O2

bool __thiscall
BamTools::PropertyFilterValue::check<unsigned_int>(PropertyFilterValue *this,uint *query)

{
  uint uVar1;
  bool bVar2;
  ostream *poVar3;
  uint *puVar4;
  char *pcVar5;
  
  bVar2 = Variant::is_type<unsigned_int>(&this->Value);
  if (bVar2) {
    bVar2 = Variant::is_type<std::__cxx11::string>(&this->Value);
    if (bVar2) {
      pcVar5 = "Cannot compare different types - query is a string!";
      goto LAB_00170969;
    }
    switch(this->Type) {
    case EXACT:
      uVar1 = *query;
      puVar4 = Variant::get<unsigned_int>(&this->Value);
      bVar2 = uVar1 == *puVar4;
      break;
    case GREATER_THAN:
      uVar1 = *query;
      puVar4 = Variant::get<unsigned_int>(&this->Value);
      bVar2 = *puVar4 < uVar1;
      break;
    case GREATER_THAN_EQUAL:
      uVar1 = *query;
      puVar4 = Variant::get<unsigned_int>(&this->Value);
      bVar2 = *puVar4 <= uVar1;
      break;
    case LESS_THAN:
      uVar1 = *query;
      puVar4 = Variant::get<unsigned_int>(&this->Value);
      bVar2 = uVar1 < *puVar4;
      break;
    case LESS_THAN_EQUAL:
      uVar1 = *query;
      puVar4 = Variant::get<unsigned_int>(&this->Value);
      bVar2 = uVar1 <= *puVar4;
      break;
    case NOT:
      uVar1 = *query;
      puVar4 = Variant::get<unsigned_int>(&this->Value);
      bVar2 = uVar1 != *puVar4;
      break;
    default:
      goto switchD_00170996_default;
    }
  }
  else {
    pcVar5 = "Cannot compare different types!";
LAB_00170969:
    poVar3 = std::operator<<((ostream *)&std::cerr,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
switchD_00170996_default:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool PropertyFilterValue::check(const T& query) const
{

    // ensure filter value & query are same type
    if (!Value.is_type<T>()) {
        std::cerr << "Cannot compare different types!" << std::endl;
        return false;
    }

    // string matching
    if (Value.is_type<std::string>()) {
        std::cerr << "Cannot compare different types - query is a string!" << std::endl;
        return false;
    }

    // numeric matching based on our filter type
    switch (Type) {
        case (PropertyFilterValue::EXACT):
            return (query == Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN):
            return (query > Value.get<T>());
        case (PropertyFilterValue::GREATER_THAN_EQUAL):
            return (query >= Value.get<T>());
        case (PropertyFilterValue::LESS_THAN):
            return (query < Value.get<T>());
        case (PropertyFilterValue::LESS_THAN_EQUAL):
            return (query <= Value.get<T>());
        case (PropertyFilterValue::NOT):
            return (query != Value.get<T>());
        default:
            BAMTOOLS_ASSERT_UNREACHABLE;
    }
    return false;
}